

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_source.hpp
# Opt level: O2

bool __thiscall ItemSource::is_npc_reward(ItemSource *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (*this->_vptr_ItemSource[2])(&local_30,this);
  bVar1 = std::operator==(&local_30,"reward");
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

[[nodiscard]] bool is_npc_reward() const { return this->type_name() == ITEM_SOURCE_TYPE_REWARD; }